

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O1

int omp_get_num_devices(void)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&RTLsMtx);
  if (iVar1 == 0) {
    uVar2 = (long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                  super__Vector_impl_data._M_start;
    pthread_mutex_unlock((pthread_mutex_t *)&RTLsMtx);
    return (int)(uVar2 >> 3) * -0x75075075;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

EXTERN int omp_get_num_devices(void) {
  RTLsMtx.lock();
  size_t Devices_size = Devices.size();
  RTLsMtx.unlock();

  DP("Call to omp_get_num_devices returning %zd\n", Devices_size);

  return Devices_size;
}